

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O1

Index __thiscall
TwoStageDynamicBayesianNetwork::IndividualToJointYiiIndices
          (TwoStageDynamicBayesianNetwork *this,Index y,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Xs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *As,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Ys)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar1;
  Index IVar2;
  
  pvVar1 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
           this->_m_IndividualToJointYiiIndices_catVector;
  if (*(long *)(pvVar1 + 8) != *(long *)pvVar1) {
    *(long *)(pvVar1 + 8) = *(long *)pvVar1;
  }
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (pvVar1,*(undefined8 *)(pvVar1 + 8),
             (Xs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (Xs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             this->_m_IndividualToJointYiiIndices_catVector,
             *(undefined8 *)
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)
               this->_m_IndividualToJointYiiIndices_catVector + 8),
             (As->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (As->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             this->_m_IndividualToJointYiiIndices_catVector,
             *(undefined8 *)
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)
               this->_m_IndividualToJointYiiIndices_catVector + 8),
             (Ys->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (Ys->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  IVar2 = IndexTools::IndividualToJointIndicesStepSize
                    (this->_m_IndividualToJointYiiIndices_catVector,
                     (this->_m_nrVals_SoI_Y_stepsize).
                     super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
                     super__Vector_impl_data._M_start[y]);
  return IVar2;
}

Assistant:

Index TwoStageDynamicBayesianNetwork::
IndividualToJointYiiIndices(Index y, 
        const vector<Index>& Xs, 
        const vector<Index>& As, 
        const vector<Index>& Ys) const
{
    _m_IndividualToJointYiiIndices_catVector->clear();
    _m_IndividualToJointYiiIndices_catVector->insert(
        _m_IndividualToJointYiiIndices_catVector->end(), Xs.begin(), Xs.end() );
    _m_IndividualToJointYiiIndices_catVector->insert(
        _m_IndividualToJointYiiIndices_catVector->end(), As.begin(), As.end() );
    _m_IndividualToJointYiiIndices_catVector->insert(
        _m_IndividualToJointYiiIndices_catVector->end(), Ys.begin(), Ys.end() );
        
    Index iiI = IndexTools::IndividualToJointIndicesStepSize(
        *_m_IndividualToJointYiiIndices_catVector,
        _m_nrVals_SoI_Y_stepsize[y] );

#if 0    
    size_t iiS = GetiiSize_Y(y);
    if( iiI >= iiS)
    {
        cerr << "error in index computation, let's see what happened"<<endl;
        iiI = IndexTools::IndividualToJointIndices(catVector,
            _m_nrVals_SoI_Y[y] );
    }
#endif
    return iiI;

}